

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall
tinyxml2::DynArray<tinyxml2::MemPoolT<120>::Block_*,_10>::EnsureCapacity
          (DynArray<tinyxml2::MemPoolT<120>::Block_*,_10> *this,int cap)

{
  Block **__src;
  Block **__dest;
  ulong uVar1;
  
  if (this->_allocated < cap) {
    uVar1 = 0xffffffffffffffff;
    if (-1 < cap) {
      uVar1 = (long)(cap * 2) << 3;
    }
    __dest = (Block **)operator_new__(uVar1);
    __src = this->_mem;
    memcpy(__dest,__src,(long)this->_size << 3);
    if (__src != (Block **)0x0 && __src != this->_pool) {
      operator_delete__(__src);
    }
    this->_mem = __dest;
    this->_allocated = cap * 2;
  }
  return;
}

Assistant:

void EnsureCapacity( int cap ) {
        TIXMLASSERT( cap > 0 );
        if ( cap > _allocated ) {
            TIXMLASSERT( cap <= INT_MAX / 2 );
            const int newAllocated = cap * 2;
            T* newMem = new T[newAllocated];
            TIXMLASSERT( newAllocated >= _size );
            memcpy( newMem, _mem, sizeof(T)*_size );	// warning: not using constructors, only works for PODs
            if ( _mem != _pool ) {
                delete [] _mem;
            }
            _mem = newMem;
            _allocated = newAllocated;
        }
    }